

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmSignature.cpp
# Opt level: O3

void __thiscall
Wasm::WasmSignature::AllocateParams(WasmSignature *this,ArgSlot count,Recycler *recycler)

{
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  Recycler *this_00;
  undefined4 *puVar4;
  WasmType *pWVar5;
  WasmCompilationException *this_01;
  undefined1 local_58 [8];
  TrackAllocData data;
  
  if (this->m_paramsCount != 0) {
    this_01 = (WasmCompilationException *)__cxa_allocate_exception(8);
    WasmCompilationException::WasmCompilationException
              (this_01,
               L"Invalid call to WasmSignature::AllocateParams: Params are already allocated");
    __cxa_throw(this_01,&WasmCompilationException::typeinfo,
                WasmCompilationException::~WasmCompilationException);
  }
  if (count != 0) {
    data.plusSize = (size_t)count;
    local_58 = (undefined1  [8])&WasmTypes::WasmType::typeinfo;
    data.typeinfo = (type_info *)0x0;
    data.count = (size_t)anon_var_dwarf_b250b29;
    data.filename._0_4_ = 0x1e;
    this_00 = Memory::Recycler::TrackAllocInfo(recycler,(TrackAllocData *)local_58);
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fb,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00f2669d;
      *puVar4 = 0;
    }
    pWVar5 = (WasmType *)
             Memory::Recycler::AllocZeroWithAttributes<(Memory::ObjectInfoBits)32,false>
                       (this_00,(ulong)count << 2);
    if (pWVar5 == (WasmType *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar4 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x1fe,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) {
LAB_00f2669d:
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      *puVar4 = 0;
    }
    Memory::Recycler::WBSetBit((char *)&this->m_params);
    (this->m_params).ptr = pWVar5;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&this->m_params);
  }
  this->m_paramsCount = count;
  return;
}

Assistant:

void WasmSignature::AllocateParams(Js::ArgSlot count, Recycler * recycler)
{
    if (GetParamCount() != 0)
    {
        throw WasmCompilationException(_u("Invalid call to WasmSignature::AllocateParams: Params are already allocated"));
    }
    if (count > 0)
    {
        m_params = RecyclerNewArrayLeafZ(recycler, Local, count);
    }
    m_paramsCount = count;
}